

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__de_iphone(stbi__png *z)

{
  undefined1 uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  undefined1 *in_RSI;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  long *in_FS_OFFSET;
  
  iVar4 = *(int *)((long)&z->idata + 4);
  iVar5 = *(int *)((long)&z->s + 4) * *(int *)&z->s;
  if (iVar4 == 4) {
    piVar6 = &stbi__unpremultiply_on_load_global;
    if (*(int *)((long)in_FS_OFFSET + -0xc) != 0) {
      piVar6 = (int *)(*in_FS_OFFSET + -0x10);
    }
    if (*piVar6 == 0) {
      if (iVar5 != 0) {
        lVar7 = 0;
        do {
          uVar1 = in_RSI[lVar7 * 4];
          in_RSI[lVar7 * 4] = in_RSI[lVar7 * 4 + 2];
          in_RSI[lVar7 * 4 + 2] = uVar1;
          lVar7 = lVar7 + 1;
        } while (iVar5 != (int)lVar7);
      }
    }
    else if (iVar5 != 0) {
      lVar7 = 0;
      do {
        bVar2 = in_RSI[lVar7 * 4 + 3];
        bVar3 = in_RSI[lVar7 * 4];
        if (bVar2 == 0) {
          in_RSI[lVar7 * 4] = in_RSI[lVar7 * 4 + 2];
          in_RSI[lVar7 * 4 + 2] = bVar3;
        }
        else {
          uVar9 = (uint)(bVar2 >> 1);
          uVar8 = (ushort)bVar2;
          in_RSI[lVar7 * 4] =
               (char)((((uint)(byte)in_RSI[lVar7 * 4 + 2] * 0x100 -
                       (uint)(byte)in_RSI[lVar7 * 4 + 2]) + uVar9 & 0xffff) / (uint)uVar8);
          in_RSI[lVar7 * 4 + 1] =
               (char)((((uint)(byte)in_RSI[lVar7 * 4 + 1] * 0x100 -
                       (uint)(byte)in_RSI[lVar7 * 4 + 1]) + uVar9 & 0xffff) / (uint)uVar8);
          in_RSI[lVar7 * 4 + 2] =
               (char)((((uint)bVar3 * 0x100 - (uint)bVar3) + uVar9 & 0xffff) / (uint)uVar8);
        }
        lVar7 = lVar7 + 1;
      } while (iVar5 != (int)lVar7);
    }
  }
  else {
    if (iVar4 != 3) {
      __assert_fail("s->img_out_n == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                    ,0x13b8,"void stbi__de_iphone(stbi__png *)");
    }
    for (; iVar5 != 0; iVar5 = iVar5 + -1) {
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[2];
      in_RSI[2] = uVar1;
      in_RSI = in_RSI + 3;
    }
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               stbi_uc half = a / 2;
               p[0] = (p[2] * 255 + half) / a;
               p[1] = (p[1] * 255 + half) / a;
               p[2] = ( t   * 255 + half) / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}